

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::BindTableInTableOutFunction
          (Binder *this,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,
          unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
          *subquery)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var2;
  pointer puVar3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_> tVar9;
  SelectNode *this_00;
  pointer pSVar10;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var11;
  Binder *pBVar12;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var13;
  pointer pBVar14;
  type other;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_58;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_50;
  undefined1 local_48 [16];
  _Head_base<0UL,_duckdb::BoundQueryNode_*,_false> local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  ClientContext *local_28;
  
  CreateBinder((Binder *)local_48,this->context,(optional_ptr<duckdb::Binder,_true>)this,
               REGULAR_BINDER);
  local_50._M_head_impl = (QueryNode *)0x0;
  this_00 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_00);
  local_58._M_head_impl = (QueryNode *)this_00;
  pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)&local_58);
  local_28 = (ClientContext *)
             (pSVar10->select_list).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar3 = (expressions->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_head_impl =
       (BoundQueryNode *)
       (pSVar10->select_list).
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Stack_30._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (pSVar10->select_list).
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pSVar10->select_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (expressions->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pSVar10->select_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  (pSVar10->select_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (expressions->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (expressions->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (expressions->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (expressions->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&stack0xffffffffffffffc8);
  _Var11._M_head_impl = (TableRef *)operator_new(0x68);
  (_Var11._M_head_impl)->type = EMPTY_FROM;
  ((_Var11._M_head_impl)->alias)._M_dataplus = (_Alloc_hider)&((_Var11._M_head_impl)->alias).field_2
  ;
  ((_Var11._M_head_impl)->alias)._M_string_length = 0;
  ((_Var11._M_head_impl)->alias).field_2._M_local_buf[0] = '\0';
  ((_Var11._M_head_impl)->sample).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
  ((_Var11._M_head_impl)->query_location).index = 0xffffffffffffffff;
  *(undefined8 *)&((_Var11._M_head_impl)->external_dependency).internal = 0;
  ((_Var11._M_head_impl)->external_dependency).internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &((_Var11._M_head_impl)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       = 0;
  ((_Var11._M_head_impl)->column_name_alias).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var11._M_head_impl)->column_name_alias).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var11._M_head_impl)->_vptr_TableRef = (_func_int **)&PTR__TableRef_01982330;
  pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
            operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                        *)&local_58);
  _Var1._M_head_impl =
       (pSVar10->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar10->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var11._M_head_impl;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
  }
  _Var4._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (QueryNode *)0x0;
  if (_Var4._M_head_impl != (QueryNode *)0x0) {
    (*(_Var4._M_head_impl)->_vptr_QueryNode[1])();
  }
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_48);
  pBVar12->can_contain_nulls = true;
  pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_48);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_50);
  BindNode((Binder *)&stack0xffffffffffffffc8,(QueryNode *)pBVar12);
  _Var13._M_head_impl = (BoundSubqueryRef *)operator_new(0x30);
  tVar9.
  super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>.
  super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
       (_Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)
       local_38._M_head_impl;
  uVar5 = local_48._0_4_;
  uVar6 = local_48._4_4_;
  uVar7 = local_48._8_4_;
  uVar8 = local_48._12_4_;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_head_impl = (BoundQueryNode *)0x0;
  ((_Var13._M_head_impl)->super_BoundTableRef).type = SUBQUERY;
  ((_Var13._M_head_impl)->super_BoundTableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
  ((_Var13._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef = &PTR__BoundSubqueryRef_0197d2c0
  ;
  *(undefined4 *)&((_Var13._M_head_impl)->binder).internal = uVar5;
  *(undefined4 *)
   ((long)&((_Var13._M_head_impl)->binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar6;
  *(undefined4 *)
   &((_Var13._M_head_impl)->binder).internal.
    super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar7;
  *(undefined4 *)
   ((long)&((_Var13._M_head_impl)->binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) =
       uVar8;
  ((_Var13._M_head_impl)->subquery).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> =
       (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
       tVar9.
       super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
       .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (subquery->
       super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
       .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl;
  (subquery->
  super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>)._M_t.
  super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
  .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl = _Var13._M_head_impl;
  if (_Var2._M_head_impl != (BoundSubqueryRef *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BoundTableRef + 8))();
  }
  pBVar14 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
            ::operator->(subquery);
  other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar14->binder);
  MoveCorrelatedExpressions(this,other);
  if ((element_type *)local_38._M_head_impl != (element_type *)0x0) {
    (*(code *)(((((element_type *)local_38._M_head_impl)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if (local_58._M_head_impl != (QueryNode *)0x0) {
    (*(local_58._M_head_impl)->_vptr_QueryNode[1])();
  }
  if ((SelectNode *)local_50._M_head_impl != (SelectNode *)0x0) {
    (*((QueryNode *)&(local_50._M_head_impl)->_vptr_QueryNode)->_vptr_QueryNode[1])();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return;
}

Assistant:

void Binder::BindTableInTableOutFunction(vector<unique_ptr<ParsedExpression>> &expressions,
                                         unique_ptr<BoundSubqueryRef> &subquery) {
	auto binder = Binder::CreateBinder(this->context, this);
	unique_ptr<QueryNode> subquery_node;
	// generate a subquery and bind that (i.e. UNNEST([1,2,3]) becomes UNNEST((SELECT [1,2,3]))
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list = std::move(expressions);
	select_node->from_table = make_uniq<EmptyTableRef>();
	subquery_node = std::move(select_node);
	binder->can_contain_nulls = true;
	auto node = binder->BindNode(*subquery_node);
	subquery = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(node));
	MoveCorrelatedExpressions(*subquery->binder);
}